

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void __thiscall Tigre::String::urlDecode(String *this)

{
  int i;
  int iVar1;
  int ii;
  String ret;
  undefined8 local_d0 [4];
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  String(&ret);
  String(&local_50,"+");
  String(&local_70," ");
  replace(this,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  String(&local_90,"%2B");
  String(&local_b0,"+");
  replace(this,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  for (iVar1 = 0; iVar1 < (int)(this->value)._M_string_length; iVar1 = iVar1 + 1) {
    i = (int)(this->value)._M_dataplus._M_p[iVar1];
    if (i == 0x25) {
      std::__cxx11::string::substr((ulong)local_d0,(ulong)this);
      __isoc99_sscanf(local_d0[0],"%x",&ii);
      std::__cxx11::string::~string((string *)local_d0);
      String((String *)local_d0,(int)(char)ii);
      std::__cxx11::string::append((string *)&ret);
      std::__cxx11::string::~string((string *)local_d0);
      iVar1 = iVar1 + 2;
    }
    else {
      String((String *)local_d0,i);
      std::__cxx11::string::append((string *)&ret);
      std::__cxx11::string::~string((string *)local_d0);
    }
  }
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::~string((string *)&ret);
  return;
}

Assistant:

void Tigre::String::urlDecode() {
    String ret;
    char ch;
    int i, ii;
    this->replace("+", " ");
    this->replace("%2B", "+");
    for (i=0; i<this->Count(); i++) {
        if (int(this->value[i])==37) {
            sscanf(this->value.substr(i+1,2).c_str(), "%x", &ii);
            ch=static_cast<char>(ii);
            ret+=ch;
            i=i+2;
        } else {
            ret+= char(this->value[i]);
        }
    }
    this->value = ret.value;
}